

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ExtPubkey * __thiscall
cfd::core::HDWallet::GeneratePubkey
          (ExtPubkey *__return_storage_ptr__,HDWallet *this,NetType network_type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path)

{
  ExtPrivkey *this_00;
  undefined1 local_a0 [8];
  ExtPrivkey privkey;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *path_local;
  NetType network_type_local;
  HDWallet *this_local;
  
  this_00 = (ExtPrivkey *)__return_storage_ptr__;
  privkey.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)path;
  ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_a0,&this->seed_,network_type);
  ExtPrivkey::DerivePubkey
            ((ExtPubkey *)this_00,(ExtPrivkey *)local_a0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             privkey.tweak_sum_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  ExtPrivkey::~ExtPrivkey(this_00);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey HDWallet::GeneratePubkey(
    NetType network_type, const std::vector<uint32_t>& path) const {
  ExtPrivkey privkey(seed_, network_type);
  return privkey.DerivePubkey(path);
}